

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLNode * __thiscall tinyxml2::XMLNode::InsertEndChild(XMLNode *this,XMLNode *addThis)

{
  XMLNode *in_RSI;
  XMLNode *in_RDI;
  XMLNode *in_stack_ffffffffffffffd8;
  XMLNode *local_8;
  
  if (in_RSI->_document == in_RDI->_document) {
    InsertChildPreamble(in_RDI,in_stack_ffffffffffffffd8);
    if (in_RDI->_lastChild == (XMLNode *)0x0) {
      in_RDI->_lastChild = in_RSI;
      in_RDI->_firstChild = in_RSI;
      in_RSI->_prev = (XMLNode *)0x0;
      in_RSI->_next = (XMLNode *)0x0;
    }
    else {
      in_RDI->_lastChild->_next = in_RSI;
      in_RSI->_prev = in_RDI->_lastChild;
      in_RDI->_lastChild = in_RSI;
      in_RSI->_next = (XMLNode *)0x0;
    }
    in_RSI->_parent = in_RDI;
    local_8 = in_RSI;
  }
  else {
    local_8 = (XMLNode *)0x0;
  }
  return local_8;
}

Assistant:

XMLNode* XMLNode::InsertEndChild( XMLNode* addThis )
{
    TIXMLASSERT( addThis );
    if ( addThis->_document != _document ) {
        TIXMLASSERT( false );
        return 0;
    }
    InsertChildPreamble( addThis );

    if ( _lastChild ) {
        TIXMLASSERT( _firstChild );
        TIXMLASSERT( _lastChild->_next == 0 );
        _lastChild->_next = addThis;
        addThis->_prev = _lastChild;
        _lastChild = addThis;

        addThis->_next = 0;
    }
    else {
        TIXMLASSERT( _firstChild == 0 );
        _firstChild = _lastChild = addThis;

        addThis->_prev = 0;
        addThis->_next = 0;
    }
    addThis->_parent = this;
    return addThis;
}